

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_CHANNEL *
channel_direct_tcpip(LIBSSH2_SESSION *session,char *host,int port,char *shost,int sport)

{
  int iVar1;
  size_t sVar2;
  uchar *local_48;
  uchar *s;
  LIBSSH2_CHANNEL *channel;
  char *pcStack_30;
  int sport_local;
  char *shost_local;
  char *pcStack_20;
  int port_local;
  char *host_local;
  LIBSSH2_SESSION *session_local;
  
  channel._4_4_ = sport;
  pcStack_30 = shost;
  shost_local._4_4_ = port;
  pcStack_20 = host;
  host_local = (char *)session;
  if (session->direct_state == libssh2_NB_state_idle) {
    sVar2 = strlen(host);
    *(size_t *)(host_local + 0x11b18) = sVar2;
    sVar2 = strlen(pcStack_30);
    *(size_t *)(host_local + 0x11b20) = sVar2;
    *(long *)(host_local + 0x11b28) =
         *(long *)(host_local + 0x11b18) + *(long *)(host_local + 0x11b20) + 0x10;
    local_48 = (uchar *)(**(code **)(host_local + 8))
                                  (*(undefined8 *)(host_local + 0x11b28),host_local);
    *(uchar **)(host_local + 0x11b10) = local_48;
    if (*(long *)(host_local + 0x11b10) == 0) {
      _libssh2_error((LIBSSH2_SESSION *)host_local,-6,
                     "Unable to allocate memory for direct-tcpip connection");
      return (LIBSSH2_CHANNEL *)0x0;
    }
    _libssh2_store_str(&local_48,pcStack_20,*(size_t *)(host_local + 0x11b18));
    _libssh2_store_u32(&local_48,shost_local._4_4_);
    _libssh2_store_str(&local_48,pcStack_30,*(size_t *)(host_local + 0x11b20));
    _libssh2_store_u32(&local_48,channel._4_4_);
  }
  s = (uchar *)_libssh2_channel_open
                         ((LIBSSH2_SESSION *)host_local,"direct-tcpip",0xc,0x200000,0x8000,
                          *(uchar **)(host_local + 0x11b10),*(size_t *)(host_local + 0x11b28));
  if (((LIBSSH2_CHANNEL *)s == (LIBSSH2_CHANNEL *)0x0) &&
     (iVar1 = libssh2_session_last_errno((LIBSSH2_SESSION *)host_local), iVar1 == -0x25)) {
    host_local[0x11b0c] = '\x02';
    host_local[0x11b0d] = '\0';
    host_local[0x11b0e] = '\0';
    host_local[0x11b0f] = '\0';
    return (LIBSSH2_CHANNEL *)0x0;
  }
  host_local[0x11b0c] = '\0';
  host_local[0x11b0d] = '\0';
  host_local[0x11b0e] = '\0';
  host_local[0x11b0f] = '\0';
  (**(code **)(host_local + 0x18))(*(undefined8 *)(host_local + 0x11b10),host_local);
  host_local[0x11b10] = '\0';
  host_local[0x11b11] = '\0';
  host_local[0x11b12] = '\0';
  host_local[0x11b13] = '\0';
  host_local[0x11b14] = '\0';
  host_local[0x11b15] = '\0';
  host_local[0x11b16] = '\0';
  host_local[0x11b17] = '\0';
  return (LIBSSH2_CHANNEL *)s;
}

Assistant:

static LIBSSH2_CHANNEL *
channel_direct_tcpip(LIBSSH2_SESSION * session, const char *host,
                     int port, const char *shost, int sport)
{
    LIBSSH2_CHANNEL *channel;
    unsigned char *s;

    if(session->direct_state == libssh2_NB_state_idle) {
        session->direct_host_len = strlen(host);
        session->direct_shost_len = strlen(shost);
        /* host_len(4) + port(4) + shost_len(4) + sport(4) */
        session->direct_message_len =
            session->direct_host_len + session->direct_shost_len + 16;

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Requesting direct-tcpip session from %s:%d to %s:%d",
                       shost, sport, host, port));

        s = session->direct_message =
            LIBSSH2_ALLOC(session, session->direct_message_len);
        if(!session->direct_message) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for "
                           "direct-tcpip connection");
            return NULL;
        }
        _libssh2_store_str(&s, host, session->direct_host_len);
        _libssh2_store_u32(&s, port);
        _libssh2_store_str(&s, shost, session->direct_shost_len);
        _libssh2_store_u32(&s, sport);
    }

    channel =
        _libssh2_channel_open(session, "direct-tcpip",
                              sizeof("direct-tcpip") - 1,
                              LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                              LIBSSH2_CHANNEL_PACKET_DEFAULT,
                              session->direct_message,
                              session->direct_message_len);

    if(!channel &&
        libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN) {
        /* The error code is still set to LIBSSH2_ERROR_EAGAIN, set our state
           to created to avoid re-creating the package on next invoke */
        session->direct_state = libssh2_NB_state_created;
        return NULL;
    }
    /* by default we set (keep?) idle state... */
    session->direct_state = libssh2_NB_state_idle;

    LIBSSH2_FREE(session, session->direct_message);
    session->direct_message = NULL;

    return channel;
}